

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_MapEntryMessageName_Test::
~ValidationErrorTest_MapEntryMessageName_Test(ValidationErrorTest_MapEntryMessageName_Test *this)

{
  ValidationErrorTest_MapEntryMessageName_Test *this_local;
  
  ~ValidationErrorTest_MapEntryMessageName_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, MapEntryMessageName) {
  FileDescriptorProto file_proto;
  FillValidMapEntry(&file_proto);
  file_proto.mutable_message_type(0)->mutable_nested_type(0)->set_name(
      "OtherMapEntry");
  file_proto.mutable_message_type(0)->mutable_field(0)->set_type_name(
      "OtherMapEntry");
  BuildFileWithErrors(file_proto, kMapEntryErrorMessage);
}